

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateProto2NamespaceEnumSpecializations
          (FileGenerator *this,Printer *printer)

{
  pointer puVar1;
  bool bVar2;
  Options *extraout_RDX;
  int i;
  ulong uVar3;
  NamespaceOpener proto_ns;
  Formatter format;
  string sStack_98;
  NamespaceOpener local_78;
  Formatter local_58;
  
  local_58.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_58.vars_._M_t,&(this->variables_)._M_t);
  bVar2 = HasEnumDefinitions(this->file_);
  if (bVar2) {
    Formatter::operator()<>(&local_58,"\n");
    ProtobufNamespace_abi_cxx11_(&sStack_98,(cpp *)&this->options_,extraout_RDX);
    NamespaceOpener::NamespaceOpener(&local_78,&sStack_98,&local_58);
    std::__cxx11::string::~string((string *)&sStack_98);
    Formatter::operator()<>(&local_58,"\n");
    for (uVar3 = 0;
        puVar1 = (this->enum_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)(this->enum_generators_).
                              super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
        uVar3 = uVar3 + 1) {
      EnumGenerator::GenerateGetEnumDescriptorSpecializations
                ((EnumGenerator *)
                 puVar1[uVar3]._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
                 ._M_t,printer);
    }
    Formatter::operator()<>(&local_58,"\n");
    NamespaceOpener::~NamespaceOpener(&local_78);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_58.vars_._M_t);
  return;
}

Assistant:

void FileGenerator::GenerateProto2NamespaceEnumSpecializations(
    io::Printer* printer) {
  Formatter format(printer, variables_);
  // Emit GetEnumDescriptor specializations into google::protobuf namespace:
  if (HasEnumDefinitions(file_)) {
    format("\n");
    {
      NamespaceOpener proto_ns(ProtobufNamespace(options_), format);
      format("\n");
      for (int i = 0; i < enum_generators_.size(); i++) {
        enum_generators_[i]->GenerateGetEnumDescriptorSpecializations(printer);
      }
      format("\n");
    }
  }
}